

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotHLines<unsigned_int>(char *label_id,uint *ys,int count,int offset,int stride)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ImPlotRange *pIVar5;
  ImPlotContext *pIVar6;
  bool bVar7;
  ImU32 col;
  ImDrawList *DrawList;
  int iVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  GetterXRefYs<unsigned_int> get_max;
  GetterXRefYs<unsigned_int> get_min;
  ImPlotLimits lims;
  TransformerLinLin local_94;
  GetterXRefYs<unsigned_int> local_90;
  GetterXRefYs<unsigned_int> local_70;
  ImPlotLimits local_50;
  
  iVar9 = 0;
  bVar7 = BeginItem(label_id,0);
  if (bVar7) {
    GetPlotLimits(&local_50,-1);
    pIVar6 = GImPlot;
    local_70.XRef = local_50.X.Min;
    if (count != 0) {
      iVar9 = (offset % count + count) % count;
    }
    local_90.XRef = local_50.X.Max;
    if (count == 0) {
      local_90.Offset = 0;
    }
    else {
      local_90.Offset = (offset % count + count) % count;
    }
    if ((0 < count) && (GImPlot->FitThisFrame != false)) {
      iVar2 = GImPlot->CurrentPlot->CurrentYAxis;
      uVar3 = GImPlot->CurrentPlot->YAxis[iVar2].Flags;
      pIVar5 = GImPlot->ExtentsY;
      iVar8 = 0;
      do {
        uVar4 = *(uint *)((long)ys +
                         (long)(((iVar9 + iVar8) % count + count) % count) * (long)stride);
        if ((uVar4 != 0) || ((uVar3 & 0x20) == 0)) {
          dVar10 = (double)uVar4;
          dVar1 = pIVar5[iVar2].Min;
          dVar11 = dVar10;
          if (dVar1 <= dVar10) {
            dVar11 = dVar1;
          }
          pIVar5[iVar2].Min = dVar11;
          dVar1 = pIVar6->ExtentsY[iVar2].Max;
          if (dVar10 <= dVar1) {
            dVar10 = dVar1;
          }
          pIVar6->ExtentsY[iVar2].Max = dVar10;
        }
        iVar8 = iVar8 + 1;
      } while (count != iVar8);
    }
    local_90.Ys = ys;
    local_90.Count = count;
    local_90.Stride = stride;
    local_70.Ys = ys;
    local_70.Count = count;
    local_70.Offset = iVar9;
    local_70.Stride = stride;
    DrawList = GetPlotDrawList();
    if ((pIVar6->NextItemData).RenderLine == true) {
      col = ImGui::GetColorU32((pIVar6->NextItemData).Colors);
      iVar9 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar9]) {
      case 0:
        local_94.YAxis = iVar9;
        RenderLineSegments<ImPlot::GetterXRefYs<unsigned_int>,ImPlot::GetterXRefYs<unsigned_int>,ImPlot::TransformerLinLin>
                  (&local_70,&local_90,&local_94,DrawList,(pIVar6->NextItemData).LineWeight,col);
        break;
      case 1:
        local_94.YAxis = iVar9;
        RenderLineSegments<ImPlot::GetterXRefYs<unsigned_int>,ImPlot::GetterXRefYs<unsigned_int>,ImPlot::TransformerLogLin>
                  (&local_70,&local_90,(TransformerLogLin *)&local_94,DrawList,
                   (pIVar6->NextItemData).LineWeight,col);
        break;
      case 2:
        local_94.YAxis = iVar9;
        RenderLineSegments<ImPlot::GetterXRefYs<unsigned_int>,ImPlot::GetterXRefYs<unsigned_int>,ImPlot::TransformerLinLog>
                  (&local_70,&local_90,(TransformerLinLog *)&local_94,DrawList,
                   (pIVar6->NextItemData).LineWeight,col);
        break;
      case 3:
        local_94.YAxis = iVar9;
        RenderLineSegments<ImPlot::GetterXRefYs<unsigned_int>,ImPlot::GetterXRefYs<unsigned_int>,ImPlot::TransformerLogLog>
                  (&local_70,&local_90,(TransformerLogLog *)&local_94,DrawList,
                   (pIVar6->NextItemData).LineWeight,col);
      }
    }
    pIVar6 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar6->NextItemData);
    pIVar6->PreviousItem = pIVar6->CurrentItem;
    pIVar6->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotHLines(const char* label_id, const T* ys, int count, int offset, int stride) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        const ImPlotLimits lims = GetPlotLimits();
        GetterXRefYs<T> get_min(lims.X.Min,ys,count,offset,stride);
        GetterXRefYs<T> get_max(lims.X.Max,ys,count,offset,stride);
        if (FitThisFrame()) {
            for (int i = 0; i < get_min.Count; ++i)
                FitPointY(get_min(i).y);
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render stems
        if (s.RenderLine) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderLineSegments(get_min, get_max, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderLineSegments(get_min, get_max, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderLineSegments(get_min, get_max, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderLineSegments(get_min, get_max, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        EndItem();
    }
}